

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netpong.cpp
# Opt level: O2

void start_game(void)

{
  undefined4 uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Am_Value *pAVar5;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0x92d8,0x66);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x92f8,100,(long)(iVar3 + -0x15) / 2 & 0xffffffff);
  pAVar5 = (Am_Value *)Am_Object::Get(0x92e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x92f8,0x65,(long)(iVar3 + -0x15) / 2 & 0xffffffff);
  Am_Object::Set(0x92f8,true,1);
  pAVar5 = (Am_Value *)Am_Object::Get(0x92e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x92e8,0x65,(long)(iVar3 + -0x3c) / 2 & 0xffffffff);
  pAVar5 = (Am_Value *)Am_Object::Get(0x92e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x92f0,0x65,(long)(iVar3 + -0x3c) / 2 & 0xffffffff);
  uVar4 = rand();
  y_offset = (uVar4 & 7) + 1;
  uVar4 = rand();
  if ((uVar4 & 1) != 0) {
    y_offset = -y_offset;
  }
  uVar4 = rand();
  x_offset = (uVar4 & 7) + 1;
  if (player1sturn == true) {
    x_offset = ~(uVar4 & 7);
  }
  cVar2 = Am_Network_Group::Am_Leader();
  if (cVar2 != '\0') {
    Am_Object::Am_Object(&local_30,&anim);
    Am_Object::Am_Object(&local_38,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_40,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor(&local_30,&local_38,uVar1,&local_40,0,0,1);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_30);
  }
  return;
}

Assistant:

void
start_game(void)
{
  ball.Set(Am_LEFT, (int)((int)window.Get(Am_WIDTH) - ball_size) / 2);
  ball.Set(Am_TOP, (int)((int)main_group.Get(Am_HEIGHT) - ball_size) / 2);
  ball.Set(Am_VISIBLE, true);
  paddle1.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  paddle2.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  y_offset = (rand() & 7) + 1;
  if (rand() & 1)
    y_offset = -y_offset;
  x_offset = (rand() & 7) + 1;
  if (player1sturn)
    x_offset = -x_offset;
  if (Am_Network.Am_Leader())
    Am_Start_Interactor(anim);
}